

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void R_MapTiltedPlane(int y,int x1)

{
  bool bVar1;
  BYTE *pBVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  int local_60;
  
  iVar7 = spanend[y] - x1;
  dVar25 = (double)((float)(x1 - centerx) * plane_sz.X +
                   (float)(centery - y) * plane_sz.Y + plane_sz.Z);
  if (plane_shade) {
    R_CalcTiltedLighting
              ((double)planelightfloat * dVar25,
               ((double)(plane_sz.X * (float)iVar7) + dVar25) * (double)planelightfloat,iVar7);
  }
  pBVar2 = dc_destorg;
  dVar15 = (double)(plane_su.X * (float)(x1 - centerx) +
                   plane_su.Y * (float)(centery - y) + plane_su.Z);
  dVar16 = (double)((float)(x1 - centerx) * plane_sv.X +
                   (float)(centery - y) * plane_sv.Y + plane_sv.Z);
  lVar10 = (long)(x1 + ylookup[y]);
  bVar8 = 0x20 - (byte)ds_ybits;
  bVar4 = bVar8 - (byte)ds_xbits;
  uVar6 = ~(-1 << ((byte)ds_xbits & 0x1f)) << ((byte)ds_ybits & 0x1f);
  dVar18 = (1.0 / dVar25) * dVar15;
  dVar17 = (1.0 / dVar25) * dVar16;
  iVar5 = iVar7 + 1;
  uVar14 = 0;
  if (0xe < iVar7) {
    fVar19 = plane_sz.X * 16.0;
    fVar21 = plane_su.X * 16.0;
    fVar22 = plane_sv.X * 16.0;
    dVar20 = dVar17;
    dVar23 = dVar18;
    iVar7 = iVar5;
    do {
      dVar16 = dVar16 + (double)fVar22;
      dVar15 = dVar15 + (double)fVar21;
      dVar25 = dVar25 + (double)fVar19;
      dVar18 = (1.0 / dVar25) * dVar15;
      dVar17 = (1.0 / dVar25) * dVar16;
      uVar3 = (int)(long)dVar23 + pviewx;
      uVar11 = (int)(long)dVar20 + pviewy;
      lVar12 = (long)(int)uVar14;
      lVar13 = lVar12 << 0x20;
      lVar9 = 0;
      do {
        pBVar2[lVar9 + lVar12 + lVar10] =
             tiltlighting[lVar9 + lVar12]
             [ds_source[uVar3 >> (bVar4 & 0x1f) & uVar6 | uVar11 >> (bVar8 & 0x1f)]];
        lVar13 = lVar13 + 0x100000000;
        local_60 = (int)(long)((dVar18 - dVar23) * 0.0625);
        uVar3 = uVar3 + local_60;
        uVar11 = uVar11 + (int)(long)((dVar17 - dVar20) * 0.0625);
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x10);
      uVar14 = (ulong)((int)uVar14 + 0x10);
      iVar5 = iVar7 + -0x10;
      bVar1 = 0x1f < iVar7;
      dVar20 = dVar17;
      dVar23 = dVar18;
      iVar7 = iVar5;
    } while (bVar1);
    uVar14 = lVar13 >> 0x20;
  }
  if (0 < iVar5) {
    if (iVar5 == 1) {
      pBVar2[uVar14 + lVar10] =
           tiltlighting[uVar14]
           [ds_source[(uint)(long)dVar18 >> (bVar4 & 0x1f) & uVar6 |
                      (uint)(long)dVar17 >> (bVar8 & 0x1f)]];
    }
    else {
      dVar20 = (double)iVar5;
      dVar23 = (double)plane_su.X;
      dVar24 = (double)plane_sv.X;
      dVar25 = 1.0 / ((double)plane_sz.X * dVar20 + dVar25);
      uVar11 = (int)(long)dVar18 + pviewx;
      uVar3 = (int)(long)dVar17 + pviewy;
      lVar9 = 0;
      do {
        pBVar2[lVar9 + lVar10 + uVar14] =
             tiltlighting[lVar9 + uVar14]
             [ds_source[uVar11 >> (bVar4 & 0x1f) & uVar6 | uVar3 >> (bVar8 & 0x1f)]];
        uVar11 = uVar11 + (int)(long)(((dVar23 * dVar20 + dVar15) * dVar25 - dVar18) *
                                     (1.0 / dVar20));
        uVar3 = uVar3 + (int)(long)((dVar25 * (dVar24 * dVar20 + dVar16) - dVar17) * (1.0 / dVar20))
        ;
        lVar9 = lVar9 + 1;
      } while (iVar5 != (int)lVar9);
    }
  }
  return;
}

Assistant:

void R_MapTiltedPlane (int y, int x1)
{
	int x2 = spanend[y];
	int width = x2 - x1;
	double iz, uz, vz;
	BYTE *fb;
	DWORD u, v;
	int i;

	iz = plane_sz[2] + plane_sz[1]*(centery-y) + plane_sz[0]*(x1-centerx);

	// Lighting is simple. It's just linear interpolation from start to end
	if (plane_shade)
	{
		uz = (iz + plane_sz[0]*width) * planelightfloat;
		vz = iz * planelightfloat;
		R_CalcTiltedLighting (vz, uz, width);
	}

	uz = plane_su[2] + plane_su[1]*(centery-y) + plane_su[0]*(x1-centerx);
	vz = plane_sv[2] + plane_sv[1]*(centery-y) + plane_sv[0]*(x1-centerx);

	fb = ylookup[y] + x1 + dc_destorg;

	BYTE vshift = 32 - ds_ybits;
	BYTE ushift = vshift - ds_xbits;
	int umask = ((1 << ds_xbits) - 1) << ds_ybits;

#if 0		// The "perfect" reference version of this routine. Pretty slow.
			// Use it only to see how things are supposed to look.
	i = 0;
	do
	{
		double z = 1.f/iz;

		u = SQWORD(uz*z) + pviewx;
		v = SQWORD(vz*z) + pviewy;
		ds_colormap = tiltlighting[i];
		fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
		iz += plane_sz[0];
		uz += plane_su[0];
		vz += plane_sv[0];
	} while (--width >= 0);
#else
//#define SPANSIZE 32
//#define INVSPAN 0.03125f
//#define SPANSIZE 8
//#define INVSPAN 0.125f
#define SPANSIZE 16
#define INVSPAN	0.0625f

	double startz = 1.f/iz;
	double startu = uz*startz;
	double startv = vz*startz;
	double izstep, uzstep, vzstep;

	izstep = plane_sz[0] * SPANSIZE;
	uzstep = plane_su[0] * SPANSIZE;
	vzstep = plane_sv[0] * SPANSIZE;
	x1 = 0;
	width++;

	while (width >= SPANSIZE)
	{
		iz += izstep;
		uz += uzstep;
		vz += vzstep;

		double endz = 1.f/iz;
		double endu = uz*endz;
		double endv = vz*endz;
		DWORD stepu = SQWORD((endu - startu) * INVSPAN);
		DWORD stepv = SQWORD((endv - startv) * INVSPAN);
		u = SQWORD(startu) + pviewx;
		v = SQWORD(startv) + pviewy;

		for (i = SPANSIZE-1; i >= 0; i--)
		{
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
			x1++;
			u += stepu;
			v += stepv;
		}
		startu = endu;
		startv = endv;
		width -= SPANSIZE;
	}
	if (width > 0)
	{
		if (width == 1)
		{
			u = SQWORD(startu);
			v = SQWORD(startv);
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
		}
		else
		{
			double left = width;
			iz += plane_sz[0] * left;
			uz += plane_su[0] * left;
			vz += plane_sv[0] * left;

			double endz = 1.f/iz;
			double endu = uz*endz;
			double endv = vz*endz;
			left = 1.f/left;
			DWORD stepu = SQWORD((endu - startu) * left);
			DWORD stepv = SQWORD((endv - startv) * left);
			u = SQWORD(startu) + pviewx;
			v = SQWORD(startv) + pviewy;

			for (; width != 0; width--)
			{
				fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
		}
	}
#endif
}